

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

TimeTscPair absl::lts_20240722::base_internal::GetTimeTscPair(void)

{
  ulong uVar1;
  int64_t iVar2;
  int64_t iVar3;
  ulong unaff_RBX;
  int iVar4;
  long lVar5;
  int64_t unaff_R14;
  TimeTscPair TVar6;
  
  lVar5 = 0x7fffffffffffffff;
  iVar4 = 10;
  do {
    iVar2 = ReadMonotonicClockNanos();
    uVar1 = rdtsc();
    iVar3 = ReadMonotonicClockNanos();
    if (iVar3 - iVar2 < lVar5) {
      unaff_RBX = uVar1 & 0xffffffff00000000 | CONCAT44((int)((ulong)iVar2 >> 0x20),(int)uVar1);
      lVar5 = iVar3 - iVar2;
      unaff_R14 = iVar2;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  TVar6.tsc = unaff_RBX;
  TVar6.time = unaff_R14;
  return TVar6;
}

Assistant:

static TimeTscPair GetTimeTscPair() {
  int64_t best_latency = std::numeric_limits<int64_t>::max();
  TimeTscPair best;
  for (int i = 0; i < 10; ++i) {
    int64_t t0 = ReadMonotonicClockNanos();
    int64_t tsc = UnscaledCycleClockWrapperForInitializeFrequency::Now();
    int64_t t1 = ReadMonotonicClockNanos();
    int64_t latency = t1 - t0;
    if (latency < best_latency) {
      best_latency = latency;
      best.time = t0;
      best.tsc = tsc;
    }
  }
  return best;
}